

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSurface.hpp
# Opt level: O0

void __thiscall tcu::Surface::setPixel(Surface *this,int x,int y,RGBA col)

{
  deUint32 dVar1;
  uint *puVar2;
  deUint32 *pixAddr;
  int pixOffset;
  int y_local;
  int x_local;
  Surface *this_local;
  RGBA col_local;
  
  this_local._4_4_ = col.m_value;
  puVar2 = de::ArrayBuffer<unsigned_int,_4UL,_4UL>::getElementPtr
                     (&this->m_pixels,(long)(y * this->m_width + x));
  dVar1 = RGBA::getPacked((RGBA *)((long)&this_local + 4));
  *puVar2 = dVar1;
  return;
}

Assistant:

inline void Surface::setPixel (int x, int y, RGBA col)
{
	DE_ASSERT(de::inBounds(x, 0, m_width) && de::inBounds(y, 0, m_height));

	const int		pixOffset	= y*m_width + x;
	deUint32*		pixAddr		= m_pixels.getElementPtr(pixOffset);

#if (DE_ENDIANNESS == DE_LITTLE_ENDIAN)
	*pixAddr = col.getPacked();
#else
	*((deUint8*)pixAddr + 0) = (deUint8)col.getRed();
	*((deUint8*)pixAddr + 1) = (deUint8)col.getGreen();
	*((deUint8*)pixAddr + 2) = (deUint8)col.getBlue();
	*((deUint8*)pixAddr + 3) = (deUint8)col.getAlpha();
#endif
}